

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::LoadModifications(cmCTestGIT *this)

{
  pointer *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  char *pcVar2;
  reference pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  Change *c;
  iterator __end1;
  iterator __begin1;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *__range1;
  string local_340;
  undefined1 local_320 [8];
  OutputLogger err;
  DiffParser out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  iterator local_1a0;
  size_type local_198;
  undefined1 local_190 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_diff_index;
  string local_170;
  undefined1 local_150 [8];
  OutputLogger ui_err;
  OutputLogger ui_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [32];
  string local_78 [32];
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_update_index;
  string git;
  cmCTestGIT *this_local;
  
  this_00 = &git_update_index.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string
            ((string *)this_00,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
  ui_out.super_LineParser.LineEnd = '\x01';
  std::__cxx11::string::string((string *)&local_b8,(string *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"update-index",(allocator<char> *)&ui_out.super_LineParser.field_0x3b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"--refresh",(allocator<char> *)&ui_out.super_LineParser.IgnoreCR);
  ui_out.super_LineParser.LineEnd = '\0';
  local_58 = &local_b8;
  local_50 = 3;
  pcVar2 = &ui_out.super_LineParser.Separator;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar2);
  __l_00._M_len = local_50;
  __l_00._M_array = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,__l_00,(allocator_type *)pcVar2);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ui_out.super_LineParser.Separator);
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
  do {
    local_3a8 = local_3a8 + -1;
    std::__cxx11::string::~string((string *)local_3a8);
  } while (local_3a8 != &local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&ui_out.super_LineParser.IgnoreCR);
  std::allocator<char>::~allocator((allocator<char> *)&ui_out.super_LineParser.field_0x3b);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&ui_err.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_150,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-err> ")
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"",
             (allocator<char> *)
             ((long)&git_diff_index.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmCTestVC::RunChild((cmCTestVC *)this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_48,(OutputParser *)&ui_err.super_LineParser.Separator,
                      (OutputParser *)local_150,&local_170,UTF8);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&git_diff_index.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  out.CurChange.Path.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::string
            ((string *)&local_240,
             (string *)
             &git_update_index.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_220,"diff-index",
             (allocator<char> *)(out.CurChange.Path.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,"-z",(allocator<char> *)(out.CurChange.Path.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"HEAD",(allocator<char> *)(out.CurChange.Path.field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,"--",(allocator<char> *)(out.CurChange.Path.field_2._M_local_buf + 0xc));
  out.CurChange.Path.field_2._M_local_buf[0xb] = '\0';
  local_1a0 = &local_240;
  local_198 = 5;
  this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(out.CurChange.Path.field_2._M_local_buf + 10);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_01);
  __l._M_len = local_198;
  __l._M_array = local_1a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_190,__l,this_01);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(out.CurChange.Path.field_2._M_local_buf + 10));
  local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0;
  do {
    local_410 = local_410 + -1;
    std::__cxx11::string::~string((string *)local_410);
  } while (local_410 != &local_240);
  std::allocator<char>::~allocator
            ((allocator<char> *)(out.CurChange.Path.field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator
            ((allocator<char> *)(out.CurChange.Path.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator
            ((allocator<char> *)(out.CurChange.Path.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(out.CurChange.Path.field_2._M_local_buf + 0xf));
  DiffParser::DiffParser((DiffParser *)&err.super_LineParser.Separator,this,"di-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_320,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"di-err> ")
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"",(allocator<char> *)((long)&__range1 + 7));
  cmCTestVC::RunChild((cmCTestVC *)this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_190,(OutputParser *)&err.super_LineParser.Separator,
                      (OutputParser *)local_320,&local_340,UTF8);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  pcVar2 = &out.super_LineParser.Separator;
  __end1 = std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::begin
                     ((vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *)
                      pcVar2);
  c = (Change *)
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::end
                ((vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *)pcVar2
                );
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                                *)&c);
    if (!bVar1) break;
    pCVar3 = __gnu_cxx::
             __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
             ::operator*(&__end1);
    (*(this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this,1,&pCVar3->Path);
    __gnu_cxx::
    __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
    ::operator++(&__end1);
  }
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_320);
  DiffParser::~DiffParser((DiffParser *)&err.super_LineParser.Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_190);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_150);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&ui_err.super_LineParser.Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  std::__cxx11::string::~string
            ((string *)
             &git_update_index.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return true;
}

Assistant:

bool cmCTestGIT::LoadModifications()
{
  std::string git = this->CommandLineTool;

  // Use 'git update-index' to refresh the index w.r.t. the work tree.
  std::vector<std::string> git_update_index = { git, "update-index",
                                                "--refresh" };
  OutputLogger ui_out(this->Log, "ui-out> ");
  OutputLogger ui_err(this->Log, "ui-err> ");
  this->RunChild(git_update_index, &ui_out, &ui_err, "",
                 cmProcessOutput::UTF8);

  // Use 'git diff-index' to get modified files.
  std::vector<std::string> git_diff_index = { git, "diff-index", "-z", "HEAD",
                                              "--" };
  DiffParser out(this, "di-out> ");
  OutputLogger err(this->Log, "di-err> ");
  this->RunChild(git_diff_index, &out, &err, "", cmProcessOutput::UTF8);

  for (Change const& c : out.Changes) {
    this->DoModification(PathModified, c.Path);
  }
  return true;
}